

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_generator_testing.h
# Opt level: O2

NonStandardLayout * __thiscall
phmap::priv::hash_internal::Generator<phmap::priv::NonStandardLayout,_void>::operator()
          (NonStandardLayout *__return_storage_ptr__,
          Generator<phmap::priv::NonStandardLayout,_void> *this)

{
  Generator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  local_31;
  string local_30;
  
  Generator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>::
  operator()(&local_30,&local_31);
  NonStandardLayout::NonStandardLayout(__return_storage_ptr__,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

NonStandardLayout operator()() const {
        return NonStandardLayout(Generator<std::string>()());
    }